

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_setup_connection(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  char *in_RAX;
  FILEPROTO *pFVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_38;
  
  local_38 = in_RAX;
  pFVar2 = (FILEPROTO *)(*Curl_ccalloc)(1,0x18);
  (data->req).p.file = pFVar2;
  if (pFVar2 != (FILEPROTO *)0x0) {
    CVar1 = Curl_urldecode((data->state).up.path,0,&local_38,(size_t *)0x0,REJECT_CTRL);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if ((*local_38 == '\\') || (pcVar4 = local_38, *local_38 == '/')) {
      pcVar4 = local_38 + 1;
    }
    pcVar4 = (*Curl_cstrdup)(pcVar4);
    (conn->proto).rtspc.buf.toobig = (size_t)pcVar4;
    (*Curl_cfree)(local_38);
    pcVar4 = (char *)(conn->proto).rtspc.buf.toobig;
    if (pcVar4 != (char *)0x0) {
      pcVar3 = strchr(pcVar4,0x2f);
      if ((pcVar3 == (char *)0x0) && (pcVar3 = strchr(pcVar4,0x5c), pcVar3 == (char *)0x0)) {
        (*Curl_cfree)(pcVar4);
        (conn->proto).ftpc.pp.sendsize = 0;
        Curl_failf(data,"missing share in URL path for SMB");
        return CURLE_URL_MALFORMAT;
      }
      *pcVar3 = '\0';
      pcVar3 = pcVar3 + 1;
      pFVar2->freepath = pcVar3;
      do {
        if (*pcVar3 == '/') {
          *pcVar3 = '\\';
        }
        else if (*pcVar3 == '\0') {
          return CURLE_OK;
        }
        pcVar3 = pcVar3 + 1;
      } while( true );
    }
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

static CURLcode smb_setup_connection(struct Curl_easy *data,
                                     struct connectdata *conn)
{
  struct smb_request *req;

  /* Initialize the request state */
  data->req.p.smb = req = calloc(1, sizeof(struct smb_request));
  if(!req)
    return CURLE_OUT_OF_MEMORY;

  /* Parse the URL path */
  return smb_parse_url_path(data, conn);
}